

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::SocketWriter
          (SocketWriter *this,string *host,string *port)

{
  (this->super_AbstractSocketWriter)._vptr_AbstractSocketWriter =
       (_func_int **)&PTR__SocketWriter_00146910;
  this->sockfd_ = -1;
  std::__cxx11::string::string((string *)&this->host_name_,(string *)host);
  std::__cxx11::string::string((string *)&this->port_num_,(string *)port);
  MakeConnection(this);
  return;
}

Assistant:

SocketWriter(const std::string& host, const std::string& port)
        : sockfd_(-1), host_name_(host), port_num_(port) {
      MakeConnection();
    }